

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMan.c
# Opt level: O1

Lpk_Man_t * Lpk_ManStart(Lpk_Par_t *pPars)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  Lpk_Man_t *__s;
  void **ppvVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  undefined8 *puVar10;
  void *pvVar11;
  Kit_DsdMan_t *pKVar12;
  uint *puVar13;
  byte bVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  
  if (0x10 < pPars->nLutsMax) {
    __assert_fail("pPars->nLutsMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkMan.c"
                  ,0x31,"Lpk_Man_t *Lpk_ManStart(Lpk_Par_t *)");
  }
  uVar1 = pPars->nVarsMax;
  uVar18 = (ulong)uVar1;
  if (0xf < uVar1 - 1) {
    __assert_fail("pPars->nVarsMax > 0 && pPars->nVarsMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkMan.c"
                  ,0x32,"Lpk_Man_t *Lpk_ManStart(Lpk_Par_t *)");
  }
  __s = (Lpk_Man_t *)malloc(0x7dc358);
  uVar19 = 0;
  memset(__s,0,0x7dc358);
  __s->pPars = pPars;
  __s->nCutsMax = 10000;
  uVar16 = 1 << ((char)uVar1 - 5U & 0x1f);
  if ((int)uVar1 < 6) {
    uVar16 = 1;
  }
  ppvVar5 = (void **)malloc(((long)(int)uVar16 * 4 + 8) * uVar18);
  lVar6 = uVar18 * 8;
  do {
    ppvVar5[uVar19] = (void *)((long)ppvVar5 + lVar6);
    uVar19 = uVar19 + 1;
    lVar6 = lVar6 + (long)(int)uVar16 * 4;
  } while (uVar18 != uVar19);
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nSize = uVar1;
  pVVar7->nCap = uVar1;
  pVVar7->pArray = ppvVar5;
  uVar19 = 0;
  do {
    pvVar11 = ppvVar5[uVar19];
    if (uVar19 < 5) {
      if (0 < (int)uVar16) {
        uVar2 = (&DAT_009e48a0)[uVar19];
        uVar17 = 0;
        do {
          *(undefined4 *)((long)pvVar11 + uVar17 * 4) = uVar2;
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
    }
    else if (0 < (int)uVar16) {
      uVar17 = 0;
      do {
        *(uint *)((long)pvVar11 + uVar17 * 4) =
             -(uint)((1 << ((char)uVar19 - 5U & 0x1f) & (uint)uVar17) != 0);
        uVar17 = uVar17 + 1;
      } while (uVar16 != uVar17);
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != uVar18);
  __s->vTtElems = pVVar7;
  iVar3 = pPars->nVarsMax;
  iVar4 = 1 << ((char)iVar3 - 5U & 0x1f);
  if (iVar3 < 6) {
    iVar4 = 1;
  }
  ppvVar5 = (void **)malloc((long)iVar4 * 0x1000 + 0x2000);
  lVar6 = 0x2000;
  lVar15 = 0;
  do {
    ppvVar5[lVar15] = (void *)((long)ppvVar5 + lVar6);
    lVar15 = lVar15 + 1;
    lVar6 = lVar6 + (long)iVar4 * 4;
  } while (lVar15 != 0x400);
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 0x400;
  pVVar7->nSize = 0x400;
  pVVar7->pArray = ppvVar5;
  __s->vTtNodes = pVVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x1000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x4000);
  pVVar8->pArray = piVar9;
  __s->vCover = pVVar8;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 0x20;
  pVVar7->nSize = 0;
  ppvVar5 = (void **)malloc(0x100);
  pVVar7->pArray = ppvVar5;
  __s->vLeaves = pVVar7;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 0x20;
  pVVar7->nSize = 0;
  ppvVar5 = (void **)malloc(0x100);
  pVVar7->pArray = ppvVar5;
  __s->vTemp = pVVar7;
  lVar6 = 0xfb846;
  do {
    puVar10 = (undefined8 *)malloc(0x10);
    *puVar10 = 100;
    pvVar11 = malloc(400);
    puVar10[1] = pvVar11;
    *(undefined8 **)(__s->pCuts[0].uSign + lVar6 * 2 + -0xb) = puVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xfb84e);
  pKVar12 = Kit_DsdManAlloc(iVar3,0x40);
  __s->pDsdMan = pKVar12;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x8000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x20000);
  pVVar8->pArray = piVar9;
  __s->vMemory = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x400);
  pVVar8->pArray = piVar9;
  __s->vBddDir = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x400);
  pVVar8->pArray = piVar9;
  __s->vBddInv = pVVar8;
  iVar3 = pPars->nVarsMax;
  bVar14 = (char)iVar3 - 5;
  iVar4 = 1 << (bVar14 & 0x1f);
  if (iVar3 < 6) {
    iVar4 = 1;
  }
  bVar20 = 0;
  if (5 < iVar3) {
    bVar20 = bVar14;
  }
  puVar13 = (uint *)malloc((long)(iVar4 << 5) << 2);
  __s->ppTruths[0][0] = puVar13;
  puVar13 = puVar13 + iVar4;
  __s->ppTruths[1][0] = puVar13;
  __s->ppTruths[1][1] = puVar13 + iVar4;
  __s->ppTruths[2][0] = puVar13 + iVar4 * 2;
  lVar6 = 0xfb817;
  do {
    *(uint **)(__s->pCuts[0].uSign + lVar6 * 2 + -0xb) =
         __s->ppTruths[2][0] + ((int)lVar6 + -0xfb816 << (bVar20 & 0x1f));
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xfb81a);
  __s->ppTruths[3][0] = __s->ppTruths[2][0] + iVar4 * 4;
  bVar20 = 0;
  if (5 < iVar3) {
    bVar20 = bVar14;
  }
  lVar6 = 0xfb827;
  do {
    *(uint **)(__s->pCuts[0].uSign + lVar6 * 2 + -0xb) =
         __s->ppTruths[3][0] + ((int)lVar6 + -0xfb826 << (bVar20 & 0x1f));
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xfb82e);
  __s->ppTruths[4][0] = __s->ppTruths[3][0] + (iVar4 << 3);
  if (iVar3 < 6) {
    bVar14 = 0;
  }
  lVar6 = 0xfb837;
  do {
    *(uint **)(__s->pCuts[0].uSign + lVar6 * 2 + -0xb) =
         __s->ppTruths[4][0] + ((int)lVar6 + -0xfb836 << (bVar14 & 0x1f));
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xfb846);
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Man_t * Lpk_ManStart( Lpk_Par_t * pPars )
{
    Lpk_Man_t * p;
    int i, nWords;
    assert( pPars->nLutsMax <= 16 );
    assert( pPars->nVarsMax > 0 && pPars->nVarsMax <= 16 );
    p = ABC_ALLOC( Lpk_Man_t, 1 );
    memset( p, 0, sizeof(Lpk_Man_t) );
    p->pPars = pPars;
    p->nCutsMax = LPK_CUTS_MAX;
    p->vTtElems = Vec_PtrAllocTruthTables( pPars->nVarsMax );
    p->vTtNodes = Vec_PtrAllocSimInfo( 1024, Abc_TruthWordNum(pPars->nVarsMax) );
    p->vCover   = Vec_IntAlloc( 1 << 12 );
    p->vLeaves  = Vec_PtrAlloc( 32 );
    p->vTemp    = Vec_PtrAlloc( 32 );
    for ( i = 0; i < 8; i++ )
        p->vSets[i] = Vec_IntAlloc(100);
    p->pDsdMan = Kit_DsdManAlloc( pPars->nVarsMax, 64 );
    p->vMemory = Vec_IntAlloc( 1024 * 32 );
    p->vBddDir = Vec_IntAlloc( 256 );
    p->vBddInv = Vec_IntAlloc( 256 );
    // allocate temporary storage for truth tables
    nWords = Kit_TruthWordNum(pPars->nVarsMax);
    p->ppTruths[0][0] = ABC_ALLOC( unsigned, 32 * nWords );
    p->ppTruths[1][0] = p->ppTruths[0][0] + 1 * nWords;
    for ( i = 1; i < 2; i++ )
        p->ppTruths[1][i] = p->ppTruths[1][0] + i * nWords;
    p->ppTruths[2][0] = p->ppTruths[1][0] + 2 * nWords;
    for ( i = 1; i < 4; i++ )
        p->ppTruths[2][i] = p->ppTruths[2][0] + i * nWords;
    p->ppTruths[3][0] = p->ppTruths[2][0] + 4 * nWords; 
    for ( i = 1; i < 8; i++ )
        p->ppTruths[3][i] = p->ppTruths[3][0] + i * nWords;
    p->ppTruths[4][0] = p->ppTruths[3][0] + 8 * nWords; 
    for ( i = 1; i < 16; i++ )
        p->ppTruths[4][i] = p->ppTruths[4][0] + i * nWords;
    return p;
}